

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O2

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  rescaler_t *prVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar12;
  ulong uVar13;
  ulong uVar11;
  
  uVar2 = wrk->num_channels;
  lVar6 = (long)(int)uVar2;
  iVar3 = wrk->dst_width;
  uVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
LAB_001138f4:
  if (uVar7 == uVar9) {
    return;
  }
  bVar1 = src[uVar7];
  uVar10 = (uint)bVar1;
  uVar11 = uVar7 + lVar6;
  if (1 < wrk->src_width) {
    bVar1 = src[uVar11];
  }
  iVar4 = wrk->x_add;
  prVar5 = wrk->frow;
  uVar13 = uVar7;
  iVar8 = iVar4;
  do {
    uVar12 = (uint)bVar1;
    do {
      prVar5[uVar13] = (uVar10 - uVar12) * iVar8 + uVar12 * iVar4;
      uVar13 = uVar13 + lVar6;
      if (iVar3 * lVar6 <= (long)uVar13) {
        uVar7 = uVar7 + 1;
        goto LAB_001138f4;
      }
      iVar8 = iVar8 - wrk->x_sub;
    } while (-1 < iVar8);
    uVar10 = (int)uVar11 + uVar2;
    uVar11 = (ulong)uVar10;
    bVar1 = src[(int)uVar10];
    iVar8 = iVar8 + iVar4;
    uVar10 = uVar12;
  } while( true );
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* WEBP_RESTRICT const wrk,
                                   const uint8_t* WEBP_RESTRICT src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}